

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O2

Type5UUIDFilenameResolver * __thiscall
AS_02::TimedText::Type5UUIDFilenameResolver::OpenRead
          (Type5UUIDFilenameResolver *this,string *dirname)

{
  int iVar1;
  char in_DL;
  string *this_00;
  DirectoryEntryType_t ft;
  string next_item;
  byte_t read_buffer [16];
  string abs_dirname;
  string tmp_path;
  DirScannerEx dir_reader;
  undefined1 local_170 [104];
  UUID asset_id;
  Result_t read_result;
  FileReader reader;
  UUID asset_id_1;
  
  Kumu::DirScannerEx::DirScannerEx(&dir_reader);
  next_item._M_dataplus._M_p = (pointer)&next_item.field_2;
  next_item._M_string_length = 0;
  next_item.field_2._M_local_buf[0] = '\0';
  Kumu::PathMakeCanonical((string *)&abs_dirname,in_DL);
  if (abs_dirname._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&abs_dirname);
  }
  Kumu::DirScannerEx::Open((string *)this);
  if (-1 < *(int *)&(this->super_IResourceResolver)._vptr_IResourceResolver) {
    while( true ) {
      Kumu::DirScannerEx::GetNext((string *)&read_result,(DirectoryEntryType_t *)&dir_reader);
      iVar1 = _read_result;
      Kumu::Result_t::~Result_t(&read_result);
      if (iVar1 < 0) break;
      if (*next_item._M_dataplus._M_p != '.') {
        Kumu::PathJoin((string *)&tmp_path,(string *)&abs_dirname,(char)&next_item);
        if (ft == DET_FILE) {
          Kumu::FileReader::FileReader(&reader);
          Kumu::FileReader::OpenRead((string *)&read_result);
          if (-1 < _read_result) {
            Kumu::FileReader::Read((uchar *)local_170,(uint)&reader,(uint *)read_buffer);
            Kumu::Result_t::operator=(&read_result,(Result_t *)local_170);
            Kumu::Result_t::~Result_t((Result_t *)local_170);
            if (-1 < _read_result) {
              if (read_buffer._0_8_ == 0xa1a0a0d474e5089) {
                Kumu::PathBasename((string *)local_170,(char)&next_item);
                CreatePNGNameId(&asset_id,(string *)local_170);
                std::__cxx11::string::~string((string *)local_170);
                std::
                pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<Kumu::UUID_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          ((pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_170,&asset_id,&next_item);
                std::
                _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                ::_M_insert_unique<std::pair<Kumu::UUID_const,std::__cxx11::string>>
                          ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                            *)&dirname->_M_string_length,
                           (pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_170);
                this_00 = (string *)(local_170 + 0x20);
              }
              else {
                iVar1 = bcmp(read_buffer,"OTTO",5);
                if (iVar1 != 0) {
                  iVar1 = bcmp(read_buffer,"",5);
                  if (iVar1 != 0) goto LAB_00145cc0;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_170,"",(allocator<char> *)&asset_id_1);
                Kumu::PathSetExtension((string *)&asset_id,(string *)&next_item);
                std::__cxx11::string::~string((string *)local_170);
                Kumu::PathBasename((string *)local_170,(char)(string *)&asset_id);
                CreateFontNameId(&asset_id_1,(string *)local_170);
                std::__cxx11::string::~string((string *)local_170);
                std::
                pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<Kumu::UUID_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          ((pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_170,&asset_id_1,&next_item);
                std::
                _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                ::_M_insert_unique<std::pair<Kumu::UUID_const,std::__cxx11::string>>
                          ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                            *)&dirname->_M_string_length,
                           (pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_170);
                std::__cxx11::string::~string((string *)(local_170 + 0x20));
                this_00 = (string *)&asset_id;
              }
              std::__cxx11::string::~string(this_00);
            }
          }
LAB_00145cc0:
          Kumu::Result_t::~Result_t(&read_result);
          Kumu::FileReader::~FileReader(&reader);
        }
        std::__cxx11::string::~string((string *)&tmp_path);
      }
    }
  }
  std::__cxx11::string::~string((string *)&abs_dirname);
  std::__cxx11::string::~string((string *)&next_item);
  Kumu::DirScannerEx::~DirScannerEx(&dir_reader);
  return this;
}

Assistant:

Result_t
AS_02::TimedText::Type5UUIDFilenameResolver::OpenRead(const std::string& dirname)
{
  DirScannerEx dir_reader;
  DirectoryEntryType_t ft;
  std::string next_item;
  std::string abs_dirname = PathMakeCanonical(dirname);
  byte_t read_buffer[16];

  if ( abs_dirname.empty() )
    {
      abs_dirname = ".";
    }

  Result_t result = dir_reader.Open(abs_dirname);

  if ( KM_SUCCESS(result) )
    {
      while ( KM_SUCCESS(dir_reader.GetNext(next_item, ft)) )
        {
          if ( next_item[0] == '.' ) continue; // no hidden files
	  std::string tmp_path = PathJoin(abs_dirname, next_item);

	  if ( ft == DET_FILE )
	    {
	      FileReader reader;
	      Result_t read_result = reader.OpenRead(tmp_path);

	      if ( KM_SUCCESS(read_result) )
		{
		  read_result = reader.Read(read_buffer, 16);
		}

	      if ( KM_SUCCESS(read_result) )
		{
		  // is it PNG?
		  if ( memcmp(read_buffer, PNGMagic, sizeof(PNGMagic)) == 0 )
		    {
		      UUID asset_id = CreatePNGNameId(PathBasename(next_item));
		      m_ResourceMap.insert(ResourceMap::value_type(asset_id, next_item));
		    }
		  // is it a font?
		  else if ( memcmp(read_buffer, OpenTypeMagic, sizeof(OpenTypeMagic)) == 0
			    || memcmp(read_buffer, TrueTypeMagic, sizeof(TrueTypeMagic)) == 0 )
		    {
		      std::string font_root_name = PathSetExtension(next_item, "");
		      UUID asset_id = CreateFontNameId(PathBasename(font_root_name));
		      m_ResourceMap.insert(ResourceMap::value_type(asset_id, next_item));
		    }
		}
	    }
	}
    }

  return result;
}